

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.h
# Opt level: O0

void zero_winner_mode_stats(BLOCK_SIZE bsize,int n_stats,WinnerModeStats *stats)

{
  byte bVar1;
  byte bVar2;
  void *__s;
  long in_RDX;
  int in_ESI;
  byte in_DIL;
  WinnerModeStats *stat;
  int i;
  int block_width;
  int block_height;
  int local_1c;
  
  if (in_RDX != 0) {
    bVar1 = block_size_high[in_DIL];
    bVar2 = block_size_wide[in_DIL];
    for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
      __s = (void *)(in_RDX + (long)local_1c * 0x40f0);
      memset(__s,0,0xb0);
      memset((void *)((long)__s + 0xb0),0,0x28);
      memset((void *)((long)__s + 0xd8),0,8);
      memset((void *)((long)__s + 0xe0),0,4);
      memset((void *)((long)__s + 0xe4),0,4);
      memset((void *)((long)__s + 0xe8),0,(long)(int)((uint)bVar2 * (uint)bVar1));
      memset((void *)((long)__s + 0x40e8),0,1);
    }
  }
  return;
}

Assistant:

static inline void zero_winner_mode_stats(BLOCK_SIZE bsize, int n_stats,
                                          WinnerModeStats *stats) {
  // When winner mode stats are not required, the memory allocation is avoided
  // for x->winner_mode_stats. The stats pointer will be NULL in such cases.
  if (stats == NULL) return;

  const int block_height = block_size_high[bsize];
  const int block_width = block_size_wide[bsize];
  for (int i = 0; i < n_stats; ++i) {
    WinnerModeStats *const stat = &stats[i];
    memset(&stat->mbmi, 0, sizeof(stat->mbmi));
    memset(&stat->rd_cost, 0, sizeof(stat->rd_cost));
    memset(&stat->rd, 0, sizeof(stat->rd));
    memset(&stat->rate_y, 0, sizeof(stat->rate_y));
    memset(&stat->rate_uv, 0, sizeof(stat->rate_uv));
    // Do not reset the whole array as it is CPU intensive.
    memset(&stat->color_index_map, 0,
           block_width * block_height * sizeof(stat->color_index_map[0]));
    memset(&stat->mode_index, 0, sizeof(stat->mode_index));
  }
}